

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s,int r,int N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  auto_arima_object paVar4;
  int iVar5;
  int iVar6;
  auto_arima_object paVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  
  iVar14 = 2;
  if (pdqmax == (int *)0x0) {
    uVar16 = 5;
    iVar11 = 5;
    iVar2 = iVar14;
  }
  else {
    uVar16 = *pdqmax;
    iVar11 = pdqmax[2];
    iVar2 = pdqmax[1];
  }
  if (PDQmax == (int *)0x0) {
    iVar13 = 1;
    iVar8 = 2;
  }
  else {
    iVar14 = *PDQmax;
    iVar13 = PDQmax[1];
    iVar8 = PDQmax[2];
  }
  if ((((0 < N) && (-1 < (int)uVar16)) && (-1 < iVar2)) &&
     (((-1 < iVar11 && (-1 < iVar14)) && ((-1 < iVar13 && (-1 < iVar8)))))) {
    iVar5 = iVar11 + uVar16 + iVar14;
    iVar6 = iVar8 + iVar5;
    iVar3 = r + 2 + iVar6;
    iVar1 = iVar3 + N;
    lVar15 = (long)iVar3;
    paVar4 = (auto_arima_object)malloc((lVar15 * lVar15 + (long)iVar1) * 8 + 0x150);
    paVar4->pmax = uVar16;
    paVar4->dmax = iVar2;
    paVar4->qmax = iVar11;
    paVar4->N = N;
    paVar4->s = s;
    paVar4->Pmax = iVar14;
    paVar4->Dmax = iVar13;
    paVar4->Qmax = iVar8;
    paVar4->M = r + 2;
    paVar4->r = r;
    paVar4->retval = 0;
    paVar4->start = 0;
    paVar4->verbose = 0;
    uVar9 = iVar1 + iVar3 * iVar3;
    paVar7 = paVar4 + 1;
    uVar12 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar12;
    }
    for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      *(undefined8 *)(&paVar4[1].N + uVar12 * 2) = 0;
    }
    paVar4->phi = (double *)paVar7;
    paVar4->theta = (double *)(&paVar7->N + (ulong)uVar16 * 2);
    paVar4->PHI = (double *)(&paVar7->N + (long)(int)(iVar11 + uVar16) * 2);
    paVar4->THETA = (double *)(&paVar7->N + (long)iVar5 * 2);
    paVar4->exog = (double *)(&paVar7->N + (long)iVar6 * 2);
    paVar4->res = (double *)(&paVar7->N + lVar15 * 2);
    paVar4->vcov = (double *)(&paVar7->N + (long)iVar1 * 2);
    paVar4->method = 0;
    paVar4->optmethod = 5;
    paVar4->mean = 0.0;
    paVar4->var = 1.0;
    paVar4->lvcov = iVar3 * iVar3;
    paVar4->ncoeff = iVar3;
    paVar4->stepwise = 1;
    paVar4->num_models = 0x5e;
    paVar4->stationary = 0;
    paVar4->approximation = (uint)(0xc < s || 0x96 < N);
    paVar4->seasonal = 1;
    paVar4->Order_max = 5;
    paVar4->alpha_test = 0.05;
    paVar4->alpha_seas = 0.05;
    paVar4->imean = 1;
    paVar4->idrift = 1;
    builtin_strncpy(paVar4->test,"kpss",5);
    builtin_strncpy(paVar4->seas,"seas",5);
    builtin_strncpy(paVar4->information_criteria,"aicc",5);
    builtin_strncpy(paVar4->type,"level",6);
    paVar4->p_start = 2;
    paVar4->q_start = 2;
    paVar4->P_start = 1;
    paVar4->Q_start = 1;
    paVar4->Q = 0;
    paVar4->P = 0;
    paVar4->D = 0;
    paVar4->q = 0;
    paVar4->p = 0;
    paVar4->d = 0;
    paVar4->aic = 0.0;
    paVar4->bic = 0.0;
    paVar4->aicc = 0.0;
    return paVar4;
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s, int r, int N) {
	auto_arima_object obj = NULL;
	int pmax,dmax,qmax,Pmax,Dmax,Qmax;
	int i,ncxreg;

	if (pdqmax == NULL) {
		pmax = 5;
		dmax = 2;
		qmax = 5;
	} else {
		pmax = pdqmax[0];
		dmax = pdqmax[1];
		qmax = pdqmax[2];
	}

	if (PDQmax == NULL) {
		Pmax = 2;
		Dmax = 1;
		Qmax = 2;
	} else {
		Pmax = PDQmax[0];
		Dmax = PDQmax[1];
		Qmax = PDQmax[2];
	}

	ncxreg = r + 2;
	if (pmax < 0 || dmax < 0 || qmax < 0 || N <= 0 || Pmax < 0 || Dmax < 0 || Qmax < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	obj = (auto_arima_object)malloc(sizeof(struct auto_arima_set) +
	 sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg + N) + sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ));

	obj->pmax = pmax;
	obj->dmax = dmax;
	obj->qmax = qmax;
	obj->N = N;
	obj->s = s;
	obj->Pmax = Pmax;
	obj->Dmax = Dmax;
	obj->Qmax = Qmax;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->verbose = 0;

	for(i = 0; i < (pmax + qmax + Pmax + Qmax + ncxreg + N) + (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ); ++i ) {
		obj->params[i] = 0.0;
	}

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[pmax];
	obj->PHI = &obj->params[pmax + qmax];
	obj->THETA = &obj->params[pmax + qmax + Pmax];
	obj->exog = &obj->params[pmax + qmax + Pmax + Qmax];
	obj->res = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg];
	obj->vcov = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg + N];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg );
	obj->ncoeff = pmax + qmax + Pmax + Qmax + ncxreg ;

	// Set Default Values

	obj->stepwise = 1;
	obj->stationary = 0;
	obj->approximation = (N > 150 || s >  12) ? 1 : 0;
	//obj->approximation = 0;
	obj->Order_max = 5;
	obj->seasonal = 1;
	obj->num_models = 94;
	obj->alpha_test = 0.05;
	obj->alpha_seas = 0.05;
	obj->imean = 1;
	obj->idrift = 1;

	strcpy(obj->test,"kpss");
	strcpy(obj->seas,"seas");
	strcpy(obj->information_criteria,"aicc");
	strcpy(obj->type,"level");

	obj->p_start = 2;
	obj->q_start = 2;
	obj->P_start = 1;
	obj->Q_start = 1;
	
	// Temporary Init
	
	obj->p = obj->d = obj->q = obj->P = obj->D = obj->Q = 0;
	obj->aic = obj->bic = obj->aicc = 0;


	return obj;
}